

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-make.c
# Opt level: O1

object_kind * money_kind(char *name,wchar_t value)

{
  ushort uVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  int iVar4;
  object_kind *poVar5;
  money *pmVar6;
  wchar_t wVar7;
  ulong uVar8;
  ulong uVar9;
  
  wVar3 = num_money_types;
  uVar1 = z_info->max_depth;
  uVar9 = (ulong)(uint)num_money_types;
  if (num_money_types < L'\x01') {
    uVar8 = 0;
  }
  else {
    uVar8 = 0;
    pmVar6 = money_type;
    do {
      iVar4 = strcmp(name,pmVar6->name);
      if (iVar4 == 0) goto LAB_001aa457;
      uVar8 = uVar8 + 1;
      pmVar6 = pmVar6 + 1;
    } while (uVar9 != uVar8);
    uVar8 = (ulong)(uint)wVar3;
  }
LAB_001aa457:
  wVar7 = (wchar_t)uVar8;
  if (wVar7 == wVar3) {
    wVar7 = (((value * 100) / (int)((uint)uVar1 * 3 + 0x1e)) * wVar3) / 100;
  }
  wVar2 = wVar3 + L'\xffffffff';
  if (wVar7 < wVar3) {
    wVar2 = wVar7;
  }
  poVar5 = lookup_kind(L'#',money_type[wVar2].type);
  return poVar5;
}

Assistant:

struct object_kind *money_kind(const char *name, int value)
{
	int rank;
	/* (Roughly) the largest possible gold drop at max depth - the precise
	 * value is derivable from the calculations in make_gold(), but this is
	 * near enough */
	int max_gold_drop = 3 * z_info->max_depth + 30;

	/* Check for specified treasure variety */
	for (rank = 0; rank < num_money_types; rank++)
		if (streq(name, money_type[rank].name))
			break;

	/* Pick a treasure variety scaled by level */
	if (rank == num_money_types)
		rank = (((value * 100) / max_gold_drop) * num_money_types) / 100;

	/* Do not create illegal treasure types */
	if (rank >= num_money_types) rank = num_money_types - 1;

	return lookup_kind(TV_GOLD, money_type[rank].type);
}